

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckFuncTypeIndex(SharedValidator *this,Var *sig_var,FuncType *out)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  pointer pTVar3;
  pointer pTVar4;
  Result RVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  Var local_70;
  
  Var::Var(&local_70,sig_var);
  RVar5 = CheckIndex(this,&local_70,this->num_types_,"function type");
  Var::~Var(&local_70);
  if (RVar5.enum_ == Error) {
    pTVar3 = (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar4 = (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pTVar3 != (pointer)0x0) {
      operator_delete(pTVar3,(long)pTVar4 - (long)pTVar3);
    }
    pTVar3 = (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar4 = (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pTVar3 != (pointer)0x0) {
      operator_delete(pTVar3,(long)pTVar4 - (long)pTVar3);
    }
    out->type_index = 0;
    RVar5.enum_ = Error;
  }
  else {
    if (sig_var->type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    _Var2 = (sig_var->field_2).index_;
    p_Var6 = (this->func_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var1 = &(this->func_types_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      do {
        bVar8 = p_Var6[1]._M_color < _Var2;
        if (!bVar8) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[bVar8];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var7[1]._M_color <= _Var2)) {
        if (out == (FuncType *)0x0) {
          return (Result)Ok;
        }
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                  (&out->params,
                   (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&p_Var7[1]._M_parent);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                  (&out->results,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var7 + 2));
        out->type_index = *(Index *)&p_Var7[2]._M_right;
        return (Result)Ok;
      }
    }
    RVar5 = PrintError(this,&sig_var->loc,"type %d is not a function");
  }
  return (Result)RVar5.enum_;
}

Assistant:

Result SharedValidator::CheckFuncTypeIndex(Var sig_var, FuncType* out) {
  Result result = CheckIndex(sig_var, num_types_, "function type");
  if (Failed(result)) {
    *out = FuncType{};
    return Result::Error;
  }

  auto iter = func_types_.find(sig_var.index());
  if (iter == func_types_.end()) {
    return PrintError(sig_var.loc, "type %d is not a function",
                      sig_var.index());
  }

  if (out) {
    *out = iter->second;
  }
  return Result::Ok;
}